

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O2

int scalar_to_cbb(CBB *out,EC_GROUP *group,EC_SCALAR *scalar)

{
  uint uVar1;
  int iVar2;
  BIGNUM *bn;
  size_t scalar_len;
  uint8_t *buf;
  
  bn = EC_GROUP_get0_order(group);
  uVar1 = BN_num_bytes(bn);
  scalar_len = (size_t)uVar1;
  iVar2 = CBB_add_space(out,&buf,scalar_len);
  if (iVar2 != 0) {
    ec_scalar_to_bytes(group,buf,&scalar_len,scalar);
  }
  return (uint)(iVar2 != 0);
}

Assistant:

static int scalar_to_cbb(CBB *out, const EC_GROUP *group,
                         const EC_SCALAR *scalar) {
  uint8_t *buf;
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  if (!CBB_add_space(out, &buf, scalar_len)) {
    return 0;
  }
  ec_scalar_to_bytes(group, buf, &scalar_len, scalar);
  return 1;
}